

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

LPBYTE __thiscall TRootHandler_MNDX::Search(TRootHandler_MNDX *this,TCascSearch *hs)

{
  TMndxMarFile *this_00;
  TMndxSearch *pSearch;
  bool bVar1;
  undefined8 *puVar2;
  LPBYTE pBVar3;
  bool bFindResult;
  bool local_39;
  TRootHandler_MNDX *local_38;
  
  this_00 = (this->MndxInfo).MarFiles[2];
  local_39 = false;
  local_38 = this;
  if (hs->pRootContext == (void *)0x0) {
    puVar2 = (undefined8 *)operator_new(0x30);
    puVar2[5] = 0;
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    *(undefined4 *)(puVar2 + 4) = 0;
    if (puVar2[1] == 0) {
      *puVar2 = "";
      puVar2[1] = 0;
    }
    hs->pRootContext = puVar2;
  }
  pSearch = (TMndxSearch *)hs->pRootContext;
  if (pSearch == (TMndxSearch *)0x0) {
    __assert_fail("hs->pRootContext != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                  ,0xbbf,"virtual LPBYTE TRootHandler_MNDX::Search(TCascSearch *)");
  }
  do {
    TMndxMarFile::DoSearch(this_00,pSearch,&local_39);
    if (local_39 == false) {
      return (LPBYTE)0x0;
    }
    if ((hs->szMask == (char *)0x0) || (*hs->szMask == '\0')) break;
    memcpy(hs->szFileName,pSearch->szFoundPath,pSearch->cchFoundPath);
    hs->szFileName[pSearch->cchFoundPath] = '\0';
    bVar1 = CheckWildCard(hs->szFileName,hs->szMask);
  } while (!bVar1);
  pBVar3 = FillFindData(local_38,hs,pSearch);
  return pBVar3;
}

Assistant:

LPBYTE Search(TCascSearch * hs)
    {
        TMndxMarFile * pMarFile = MndxInfo.MarFiles[2];
        TMndxSearch * pSearch = NULL;
        bool bFindResult = false;

        // If the first time, allocate the structure for the search result
        if(hs->pRootContext == NULL)
        {
            // Create the new search structure
            pSearch = new TMndxSearch;
            if(pSearch == NULL)
                return NULL;

            // Setup the search mask
            pSearch->SetSearchMask("", 0);
            hs->pRootContext = pSearch;
        }

        // Make shortcut for the search structure
        assert(hs->pRootContext != NULL);
        pSearch = (TMndxSearch *)hs->pRootContext;

        // Keep searching
        for(;;)
        {
            // Search the next file name
            pMarFile->DoSearch(pSearch, &bFindResult);
            if (bFindResult == false)
                return NULL;

            // If we have no wild mask, we found it
            if (hs->szMask == NULL || hs->szMask[0] == 0)
                break;

            // Copy the found name to the buffer
            memcpy(hs->szFileName, pSearch->szFoundPath, pSearch->cchFoundPath);
            hs->szFileName[pSearch->cchFoundPath] = 0;
            if (CheckWildCard(hs->szFileName, hs->szMask))
                break;
        }

        // Give the file size and CKey
        return FillFindData(hs, pSearch);
    }